

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_catch::dump(statement_catch *this,ostream *param_1)

{
  runtime_error *this_00;
  allocator local_31;
  string local_30;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_30,"Do not allowed standalone catch statement.",&local_31);
  runtime_error::runtime_error(this_00,&local_30);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void dump(std::ostream &) const override
		{
			throw runtime_error("Do not allowed standalone catch statement.");
		}